

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<4,_1,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  RTCIntersectArguments *pRVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  bool bVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined4 uVar37;
  ulong unaff_R13;
  size_t mask;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar61;
  float fVar67;
  float fVar68;
  undefined1 auVar62 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  float fVar90;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar93 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar107 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar116 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_d4c;
  ulong local_d48;
  ulong local_d40;
  ulong *local_d38;
  ulong local_d30;
  ulong local_d28;
  undefined1 local_d20 [16];
  undefined1 local_d10 [16];
  undefined1 local_d00 [16];
  undefined1 local_cf0 [16];
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [16];
  float local_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined1 local_ca0 [16];
  undefined1 local_c90 [16];
  undefined1 local_c80 [16];
  ulong local_c68;
  undefined8 local_c60;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined1 local_c40 [32];
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  uint local_c08;
  uint local_c04;
  uint local_c00;
  RTCFilterFunctionNArguments local_bf0;
  undefined1 local_bc0 [32];
  Scene *local_ba0;
  undefined1 auStack_b98 [24];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined4 local_b00;
  undefined4 uStack_afc;
  undefined4 uStack_af8;
  undefined4 uStack_af4;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  undefined4 uStack_ae8;
  undefined4 uStack_ae4;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  ulong local_800 [250];
  float fVar79;
  float fVar87;
  float fVar88;
  float fVar89;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar90 = ray->tfar;
    if (0.0 <= fVar90) {
      local_d38 = local_800 + 1;
      local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar41 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar42._8_4_ = 0x7fffffff;
      auVar42._0_8_ = 0x7fffffff7fffffff;
      auVar42._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx((undefined1  [16])aVar2,auVar42);
      auVar80._8_4_ = 0x219392ef;
      auVar80._0_8_ = 0x219392ef219392ef;
      auVar80._12_4_ = 0x219392ef;
      auVar42 = vcmpps_avx(auVar42,auVar80,1);
      auVar81._8_4_ = 0x3f800000;
      auVar81._0_8_ = &DAT_3f8000003f800000;
      auVar81._12_4_ = 0x3f800000;
      auVar80 = vdivps_avx(auVar81,(undefined1  [16])aVar2);
      auVar82._8_4_ = 0x5d5e0b6b;
      auVar82._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar82._12_4_ = 0x5d5e0b6b;
      auVar42 = vblendvps_avx(auVar80,auVar82,auVar42);
      auVar73._0_4_ = auVar42._0_4_ * 0.99999964;
      auVar73._4_4_ = auVar42._4_4_ * 0.99999964;
      auVar73._8_4_ = auVar42._8_4_ * 0.99999964;
      auVar73._12_4_ = auVar42._12_4_ * 0.99999964;
      auVar62._0_4_ = auVar42._0_4_ * 1.0000004;
      auVar62._4_4_ = auVar42._4_4_ * 1.0000004;
      auVar62._8_4_ = auVar42._8_4_ * 1.0000004;
      auVar62._12_4_ = auVar42._12_4_ * 1.0000004;
      uVar37 = *(undefined4 *)&(ray->org).field_0;
      local_c80._4_4_ = uVar37;
      local_c80._0_4_ = uVar37;
      local_c80._8_4_ = uVar37;
      local_c80._12_4_ = uVar37;
      auVar100 = ZEXT1664(local_c80);
      uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_c90._4_4_ = uVar37;
      local_c90._0_4_ = uVar37;
      local_c90._8_4_ = uVar37;
      local_c90._12_4_ = uVar37;
      auVar104 = ZEXT1664(local_c90);
      uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_ca0._4_4_ = uVar37;
      local_ca0._0_4_ = uVar37;
      local_ca0._8_4_ = uVar37;
      local_ca0._12_4_ = uVar37;
      auVar107 = ZEXT1664(local_ca0);
      auVar42 = vmovshdup_avx(auVar73);
      local_cc0 = vshufps_avx(auVar73,auVar73,0x55);
      auVar113 = ZEXT1664(local_cc0);
      auVar80 = vshufpd_avx(auVar73,auVar73,1);
      local_cd0 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar114 = ZEXT1664(local_cd0);
      local_cf0 = vshufps_avx(auVar62,auVar62,0x55);
      auVar124 = ZEXT1664(local_cf0);
      local_d00 = vshufps_avx(auVar62,auVar62,0xaa);
      auVar126 = ZEXT1664(local_d00);
      local_d40 = (ulong)(auVar73._0_4_ < 0.0) << 4;
      local_d48 = (ulong)(auVar42._0_4_ < 0.0) << 4 | 0x20;
      uVar35 = (ulong)(auVar80._0_4_ < 0.0) << 4 | 0x40;
      uVar36 = local_d40 ^ 0x10;
      uVar38 = local_d48 ^ 0x10;
      uVar39 = uVar35 ^ 0x10;
      uVar37 = auVar41._0_4_;
      local_d10._4_4_ = uVar37;
      local_d10._0_4_ = uVar37;
      local_d10._8_4_ = uVar37;
      local_d10._12_4_ = uVar37;
      auVar86 = ZEXT1664(local_d10);
      local_d20._4_4_ = fVar90;
      local_d20._0_4_ = fVar90;
      local_d20._8_4_ = fVar90;
      local_d20._12_4_ = fVar90;
      auVar93 = ZEXT1664(local_d20);
      local_b20._16_16_ = mm_lookupmask_ps._240_16_;
      local_b20._0_16_ = mm_lookupmask_ps._0_16_;
      auVar55._8_4_ = 0x3f800000;
      auVar55._0_8_ = &DAT_3f8000003f800000;
      auVar55._12_4_ = 0x3f800000;
      auVar55._16_4_ = 0x3f800000;
      auVar55._20_4_ = 0x3f800000;
      auVar55._24_4_ = 0x3f800000;
      auVar55._28_4_ = 0x3f800000;
      auVar43._8_4_ = 0xbf800000;
      auVar43._0_8_ = 0xbf800000bf800000;
      auVar43._12_4_ = 0xbf800000;
      auVar43._16_4_ = 0xbf800000;
      auVar43._20_4_ = 0xbf800000;
      auVar43._24_4_ = 0xbf800000;
      auVar43._28_4_ = 0xbf800000;
      local_b40 = vblendvps_avx(auVar55,auVar43,local_b20);
      fVar90 = auVar73._0_4_;
      fVar94 = auVar73._0_4_;
      fVar95 = auVar73._0_4_;
      fVar96 = auVar62._0_4_;
      fVar97 = auVar62._0_4_;
      fVar98 = auVar62._0_4_;
      local_d30 = uVar39;
      local_d28 = uVar38;
      local_ce0 = auVar62._0_4_;
      fStack_cdc = auVar62._0_4_;
      fStack_cd8 = auVar62._0_4_;
      fStack_cd4 = auVar62._0_4_;
      local_cb0 = auVar73._0_4_;
      fStack_cac = auVar73._0_4_;
      fStack_ca8 = auVar73._0_4_;
      fStack_ca4 = auVar73._0_4_;
      do {
        if (local_d38 == local_800) {
          return;
        }
        uVar34 = local_d38[-1];
        local_d38 = local_d38 + -1;
        do {
          if ((uVar34 & 8) == 0) {
            auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + local_d40),auVar100._0_16_);
            auVar41._0_4_ = auVar73._0_4_ * auVar42._0_4_;
            auVar41._4_4_ = fVar90 * auVar42._4_4_;
            auVar41._8_4_ = fVar94 * auVar42._8_4_;
            auVar41._12_4_ = fVar95 * auVar42._12_4_;
            auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + local_d48),auVar104._0_16_);
            auVar47._0_4_ = auVar113._0_4_ * auVar42._0_4_;
            auVar47._4_4_ = auVar113._4_4_ * auVar42._4_4_;
            auVar47._8_4_ = auVar113._8_4_ * auVar42._8_4_;
            auVar47._12_4_ = auVar113._12_4_ * auVar42._12_4_;
            auVar42 = vmaxps_avx(auVar41,auVar47);
            auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + uVar35),auVar107._0_16_);
            auVar48._0_4_ = auVar114._0_4_ * auVar80._0_4_;
            auVar48._4_4_ = auVar114._4_4_ * auVar80._4_4_;
            auVar48._8_4_ = auVar114._8_4_ * auVar80._8_4_;
            auVar48._12_4_ = auVar114._12_4_ * auVar80._12_4_;
            auVar80 = vmaxps_avx(auVar48,auVar86._0_16_);
            auVar42 = vmaxps_avx(auVar42,auVar80);
            auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + uVar36),auVar100._0_16_);
            auVar49._0_4_ = auVar62._0_4_ * auVar80._0_4_;
            auVar49._4_4_ = fVar96 * auVar80._4_4_;
            auVar49._8_4_ = fVar97 * auVar80._8_4_;
            auVar49._12_4_ = fVar98 * auVar80._12_4_;
            auVar80 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + uVar38),auVar104._0_16_);
            auVar53._0_4_ = auVar124._0_4_ * auVar80._0_4_;
            auVar53._4_4_ = auVar124._4_4_ * auVar80._4_4_;
            auVar53._8_4_ = auVar124._8_4_ * auVar80._8_4_;
            auVar53._12_4_ = auVar124._12_4_ * auVar80._12_4_;
            auVar80 = vminps_avx(auVar49,auVar53);
            auVar41 = vsubps_avx(*(undefined1 (*) [16])(uVar34 + 0x20 + uVar39),auVar107._0_16_);
            auVar54._0_4_ = auVar126._0_4_ * auVar41._0_4_;
            auVar54._4_4_ = auVar126._4_4_ * auVar41._4_4_;
            auVar54._8_4_ = auVar126._8_4_ * auVar41._8_4_;
            auVar54._12_4_ = auVar126._12_4_ * auVar41._12_4_;
            auVar41 = vminps_avx(auVar54,auVar93._0_16_);
            auVar80 = vminps_avx(auVar80,auVar41);
            auVar42 = vcmpps_avx(auVar42,auVar80,2);
            uVar37 = vmovmskps_avx(auVar42);
            unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar37);
          }
          if ((uVar34 & 8) == 0) {
            if (unaff_R13 == 0) {
              iVar29 = 4;
            }
            else {
              uVar33 = uVar34 & 0xfffffffffffffff0;
              lVar32 = 0;
              for (uVar34 = unaff_R13; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
              {
                lVar32 = lVar32 + 1;
              }
              for (uVar30 = unaff_R13 - 1 & unaff_R13; uVar34 = *(ulong *)(uVar33 + lVar32 * 8),
                  uVar30 != 0; uVar30 = uVar30 - 1 & uVar30) {
                *local_d38 = uVar34;
                local_d38 = local_d38 + 1;
                lVar32 = 0;
                for (uVar34 = uVar30; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
                {
                  lVar32 = lVar32 + 1;
                }
              }
              iVar29 = 0;
            }
          }
          else {
            iVar29 = 6;
          }
        } while (iVar29 == 0);
        if (iVar29 == 6) {
          iVar29 = 0;
          local_c68 = (ulong)((uint)uVar34 & 0xf) - 8;
          bVar40 = local_c68 != 0;
          if (bVar40) {
            uVar34 = uVar34 & 0xfffffffffffffff0;
            uVar33 = 0;
            do {
              lVar31 = uVar33 * 0xe0;
              lVar32 = uVar34 + 0xd0 + lVar31;
              local_a00 = *(undefined8 *)(lVar32 + 0x10);
              uStack_9f8 = *(undefined8 *)(lVar32 + 0x18);
              lVar32 = uVar34 + 0xc0 + lVar31;
              local_9e0 = *(undefined8 *)(lVar32 + 0x10);
              uStack_9d8 = *(undefined8 *)(lVar32 + 0x18);
              uStack_9d0 = local_9e0;
              uStack_9c8 = uStack_9d8;
              uStack_9f0 = local_a00;
              uStack_9e8 = uStack_9f8;
              auVar44._16_16_ = *(undefined1 (*) [16])(uVar34 + 0x60 + lVar31);
              auVar44._0_16_ = *(undefined1 (*) [16])(uVar34 + lVar31);
              auVar50._16_16_ = *(undefined1 (*) [16])(uVar34 + 0x70 + lVar31);
              auVar50._0_16_ = *(undefined1 (*) [16])(uVar34 + 0x10 + lVar31);
              auVar56._16_16_ = *(undefined1 (*) [16])(uVar34 + 0x80 + lVar31);
              auVar56._0_16_ = *(undefined1 (*) [16])(uVar34 + 0x20 + lVar31);
              auVar42 = *(undefined1 (*) [16])(uVar34 + 0x30 + lVar31);
              auVar63._16_16_ = auVar42;
              auVar63._0_16_ = auVar42;
              auVar42 = *(undefined1 (*) [16])(uVar34 + 0x40 + lVar31);
              auVar74._16_16_ = auVar42;
              auVar74._0_16_ = auVar42;
              auVar42 = *(undefined1 (*) [16])(uVar34 + 0x50 + lVar31);
              auVar99._16_16_ = auVar42;
              auVar99._0_16_ = auVar42;
              auVar42 = *(undefined1 (*) [16])(uVar34 + 0x90 + lVar31);
              auVar91._16_16_ = auVar42;
              auVar91._0_16_ = auVar42;
              auVar42 = *(undefined1 (*) [16])(uVar34 + 0xa0 + lVar31);
              auVar101._16_16_ = auVar42;
              auVar101._0_16_ = auVar42;
              auVar42 = *(undefined1 (*) [16])(uVar34 + 0xb0 + lVar31);
              auVar125._16_16_ = auVar42;
              auVar125._0_16_ = auVar42;
              uVar37 = *(undefined4 *)&(ray->org).field_0;
              auVar111._4_4_ = uVar37;
              auVar111._0_4_ = uVar37;
              auVar111._8_4_ = uVar37;
              auVar111._12_4_ = uVar37;
              auVar111._16_4_ = uVar37;
              auVar111._20_4_ = uVar37;
              auVar111._24_4_ = uVar37;
              auVar111._28_4_ = uVar37;
              uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar116._4_4_ = uVar37;
              auVar116._0_4_ = uVar37;
              auVar116._8_4_ = uVar37;
              auVar116._12_4_ = uVar37;
              auVar116._16_4_ = uVar37;
              auVar116._20_4_ = uVar37;
              auVar116._24_4_ = uVar37;
              auVar116._28_4_ = uVar37;
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar123._4_4_ = uVar1;
              auVar123._0_4_ = uVar1;
              auVar123._8_4_ = uVar1;
              auVar123._12_4_ = uVar1;
              auVar123._16_4_ = uVar1;
              auVar123._20_4_ = uVar1;
              auVar123._24_4_ = uVar1;
              auVar123._28_4_ = uVar1;
              local_b60 = vsubps_avx(auVar44,auVar111);
              local_b80 = vsubps_avx(auVar50,auVar116);
              local_a20 = vsubps_avx(auVar56,auVar123);
              auVar43 = vsubps_avx(auVar63,auVar111);
              auVar55 = vsubps_avx(auVar74,auVar116);
              auVar84 = vsubps_avx(auVar99,auVar123);
              auVar44 = vsubps_avx(auVar91,auVar111);
              auVar50 = vsubps_avx(auVar101,auVar116);
              auVar11 = vsubps_avx(auVar125,auVar123);
              local_a40 = vsubps_avx(auVar44,local_b60);
              local_a80 = vsubps_avx(auVar50,local_b80);
              local_a60 = vsubps_avx(auVar11,local_a20);
              auVar45._0_4_ = auVar44._0_4_ + local_b60._0_4_;
              auVar45._4_4_ = auVar44._4_4_ + local_b60._4_4_;
              auVar45._8_4_ = auVar44._8_4_ + local_b60._8_4_;
              auVar45._12_4_ = auVar44._12_4_ + local_b60._12_4_;
              auVar45._16_4_ = auVar44._16_4_ + local_b60._16_4_;
              auVar45._20_4_ = auVar44._20_4_ + local_b60._20_4_;
              auVar45._24_4_ = auVar44._24_4_ + local_b60._24_4_;
              auVar45._28_4_ = auVar44._28_4_ + local_b60._28_4_;
              auVar64._0_4_ = auVar50._0_4_ + local_b80._0_4_;
              auVar64._4_4_ = auVar50._4_4_ + local_b80._4_4_;
              auVar64._8_4_ = auVar50._8_4_ + local_b80._8_4_;
              auVar64._12_4_ = auVar50._12_4_ + local_b80._12_4_;
              auVar64._16_4_ = auVar50._16_4_ + local_b80._16_4_;
              auVar64._20_4_ = auVar50._20_4_ + local_b80._20_4_;
              auVar64._24_4_ = auVar50._24_4_ + local_b80._24_4_;
              auVar64._28_4_ = auVar50._28_4_ + local_b80._28_4_;
              fVar4 = local_a20._0_4_;
              auVar75._0_4_ = auVar11._0_4_ + fVar4;
              fVar5 = local_a20._4_4_;
              auVar75._4_4_ = auVar11._4_4_ + fVar5;
              fVar6 = local_a20._8_4_;
              auVar75._8_4_ = auVar11._8_4_ + fVar6;
              fVar7 = local_a20._12_4_;
              auVar75._12_4_ = auVar11._12_4_ + fVar7;
              fVar8 = local_a20._16_4_;
              auVar75._16_4_ = auVar11._16_4_ + fVar8;
              fVar9 = local_a20._20_4_;
              auVar75._20_4_ = auVar11._20_4_ + fVar9;
              fVar10 = local_a20._24_4_;
              auVar75._24_4_ = auVar11._24_4_ + fVar10;
              auVar75._28_4_ = auVar11._28_4_ + local_a20._28_4_;
              auVar12._4_4_ = local_a60._4_4_ * auVar64._4_4_;
              auVar12._0_4_ = local_a60._0_4_ * auVar64._0_4_;
              auVar12._8_4_ = local_a60._8_4_ * auVar64._8_4_;
              auVar12._12_4_ = local_a60._12_4_ * auVar64._12_4_;
              auVar12._16_4_ = local_a60._16_4_ * auVar64._16_4_;
              auVar12._20_4_ = local_a60._20_4_ * auVar64._20_4_;
              auVar12._24_4_ = local_a60._24_4_ * auVar64._24_4_;
              auVar12._28_4_ = uVar37;
              auVar80 = vfmsub231ps_fma(auVar12,local_a80,auVar75);
              auVar13._4_4_ = auVar75._4_4_ * local_a40._4_4_;
              auVar13._0_4_ = auVar75._0_4_ * local_a40._0_4_;
              auVar13._8_4_ = auVar75._8_4_ * local_a40._8_4_;
              auVar13._12_4_ = auVar75._12_4_ * local_a40._12_4_;
              auVar13._16_4_ = auVar75._16_4_ * local_a40._16_4_;
              auVar13._20_4_ = auVar75._20_4_ * local_a40._20_4_;
              auVar13._24_4_ = auVar75._24_4_ * local_a40._24_4_;
              auVar13._28_4_ = auVar75._28_4_;
              auVar42 = vfmsub231ps_fma(auVar13,local_a60,auVar45);
              auVar14._4_4_ = local_a80._4_4_ * auVar45._4_4_;
              auVar14._0_4_ = local_a80._0_4_ * auVar45._0_4_;
              auVar14._8_4_ = local_a80._8_4_ * auVar45._8_4_;
              auVar14._12_4_ = local_a80._12_4_ * auVar45._12_4_;
              auVar14._16_4_ = local_a80._16_4_ * auVar45._16_4_;
              auVar14._20_4_ = local_a80._20_4_ * auVar45._20_4_;
              auVar14._24_4_ = local_a80._24_4_ * auVar45._24_4_;
              auVar14._28_4_ = auVar45._28_4_;
              auVar41 = vfmsub231ps_fma(auVar14,local_a40,auVar64);
              uVar37 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              local_c40._4_4_ = uVar37;
              local_c40._0_4_ = uVar37;
              local_c40._8_4_ = uVar37;
              local_c40._12_4_ = uVar37;
              local_c40._16_4_ = uVar37;
              local_c40._20_4_ = uVar37;
              local_c40._24_4_ = uVar37;
              local_c40._28_4_ = uVar37;
              local_c60._4_4_ = (ray->dir).field_0.m128[2];
              auVar46._0_4_ = local_c60._4_4_ * auVar41._0_4_;
              auVar46._4_4_ = local_c60._4_4_ * auVar41._4_4_;
              auVar46._8_4_ = local_c60._4_4_ * auVar41._8_4_;
              auVar46._12_4_ = local_c60._4_4_ * auVar41._12_4_;
              auVar46._16_4_ = local_c60._4_4_ * 0.0;
              auVar46._20_4_ = local_c60._4_4_ * 0.0;
              auVar46._24_4_ = local_c60._4_4_ * 0.0;
              auVar46._28_4_ = 0;
              auVar42 = vfmadd231ps_fma(auVar46,local_c40,ZEXT1632(auVar42));
              uVar37 = *(undefined4 *)&(ray->dir).field_0;
              auVar65._4_4_ = uVar37;
              auVar65._0_4_ = uVar37;
              auVar65._8_4_ = uVar37;
              auVar65._12_4_ = uVar37;
              auVar65._16_4_ = uVar37;
              auVar65._20_4_ = uVar37;
              auVar65._24_4_ = uVar37;
              auVar65._28_4_ = uVar37;
              auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar65,ZEXT1632(auVar80));
              local_aa0 = vsubps_avx(local_b80,auVar55);
              local_ac0 = vsubps_avx(local_a20,auVar84);
              auVar66._0_4_ = local_b80._0_4_ + auVar55._0_4_;
              auVar66._4_4_ = local_b80._4_4_ + auVar55._4_4_;
              auVar66._8_4_ = local_b80._8_4_ + auVar55._8_4_;
              auVar66._12_4_ = local_b80._12_4_ + auVar55._12_4_;
              auVar66._16_4_ = local_b80._16_4_ + auVar55._16_4_;
              auVar66._20_4_ = local_b80._20_4_ + auVar55._20_4_;
              auVar66._24_4_ = local_b80._24_4_ + auVar55._24_4_;
              auVar66._28_4_ = local_b80._28_4_ + auVar55._28_4_;
              auVar76._0_4_ = auVar84._0_4_ + fVar4;
              auVar76._4_4_ = auVar84._4_4_ + fVar5;
              auVar76._8_4_ = auVar84._8_4_ + fVar6;
              auVar76._12_4_ = auVar84._12_4_ + fVar7;
              auVar76._16_4_ = auVar84._16_4_ + fVar8;
              auVar76._20_4_ = auVar84._20_4_ + fVar9;
              auVar76._24_4_ = auVar84._24_4_ + fVar10;
              auVar76._28_4_ = auVar84._28_4_ + local_a20._28_4_;
              fVar115 = local_ac0._0_4_;
              fVar117 = local_ac0._4_4_;
              auVar15._4_4_ = fVar117 * auVar66._4_4_;
              auVar15._0_4_ = fVar115 * auVar66._0_4_;
              fVar118 = local_ac0._8_4_;
              auVar15._8_4_ = fVar118 * auVar66._8_4_;
              fVar119 = local_ac0._12_4_;
              auVar15._12_4_ = fVar119 * auVar66._12_4_;
              fVar120 = local_ac0._16_4_;
              auVar15._16_4_ = fVar120 * auVar66._16_4_;
              fVar121 = local_ac0._20_4_;
              auVar15._20_4_ = fVar121 * auVar66._20_4_;
              fVar122 = local_ac0._24_4_;
              auVar15._24_4_ = fVar122 * auVar66._24_4_;
              auVar15._28_4_ = local_a40._28_4_;
              auVar41 = vfmsub231ps_fma(auVar15,local_aa0,auVar76);
              auVar12 = vsubps_avx(local_b60,auVar43);
              fVar61 = auVar12._0_4_;
              fVar67 = auVar12._4_4_;
              auVar16._4_4_ = auVar76._4_4_ * fVar67;
              auVar16._0_4_ = auVar76._0_4_ * fVar61;
              fVar68 = auVar12._8_4_;
              auVar16._8_4_ = auVar76._8_4_ * fVar68;
              fVar69 = auVar12._12_4_;
              auVar16._12_4_ = auVar76._12_4_ * fVar69;
              fVar70 = auVar12._16_4_;
              auVar16._16_4_ = auVar76._16_4_ * fVar70;
              fVar71 = auVar12._20_4_;
              auVar16._20_4_ = auVar76._20_4_ * fVar71;
              fVar72 = auVar12._24_4_;
              auVar16._24_4_ = auVar76._24_4_ * fVar72;
              auVar16._28_4_ = local_a60._28_4_;
              auVar77._0_4_ = auVar43._0_4_ + local_b60._0_4_;
              auVar77._4_4_ = auVar43._4_4_ + local_b60._4_4_;
              auVar77._8_4_ = auVar43._8_4_ + local_b60._8_4_;
              auVar77._12_4_ = auVar43._12_4_ + local_b60._12_4_;
              auVar77._16_4_ = auVar43._16_4_ + local_b60._16_4_;
              auVar77._20_4_ = auVar43._20_4_ + local_b60._20_4_;
              auVar77._24_4_ = auVar43._24_4_ + local_b60._24_4_;
              auVar77._28_4_ = auVar43._28_4_ + local_b60._28_4_;
              auVar80 = vfmsub231ps_fma(auVar16,local_ac0,auVar77);
              fVar79 = local_aa0._0_4_;
              fVar87 = local_aa0._4_4_;
              auVar17._4_4_ = fVar87 * auVar77._4_4_;
              auVar17._0_4_ = fVar79 * auVar77._0_4_;
              fVar88 = local_aa0._8_4_;
              auVar17._8_4_ = fVar88 * auVar77._8_4_;
              fVar89 = local_aa0._12_4_;
              auVar17._12_4_ = fVar89 * auVar77._12_4_;
              fVar108 = local_aa0._16_4_;
              auVar17._16_4_ = fVar108 * auVar77._16_4_;
              fVar109 = local_aa0._20_4_;
              auVar17._20_4_ = fVar109 * auVar77._20_4_;
              fVar110 = local_aa0._24_4_;
              auVar17._24_4_ = fVar110 * auVar77._24_4_;
              auVar17._28_4_ = auVar77._28_4_;
              auVar62 = vfmsub231ps_fma(auVar17,auVar12,auVar66);
              auVar78._0_4_ = local_c60._4_4_ * auVar62._0_4_;
              auVar78._4_4_ = local_c60._4_4_ * auVar62._4_4_;
              auVar78._8_4_ = local_c60._4_4_ * auVar62._8_4_;
              auVar78._12_4_ = local_c60._4_4_ * auVar62._12_4_;
              auVar78._16_4_ = local_c60._4_4_ * 0.0;
              auVar78._20_4_ = local_c60._4_4_ * 0.0;
              auVar78._24_4_ = local_c60._4_4_ * 0.0;
              auVar78._28_4_ = 0;
              auVar80 = vfmadd231ps_fma(auVar78,local_c40,ZEXT1632(auVar80));
              auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar65,ZEXT1632(auVar41));
              auVar13 = vsubps_avx(auVar43,auVar44);
              auVar57._0_4_ = auVar43._0_4_ + auVar44._0_4_;
              auVar57._4_4_ = auVar43._4_4_ + auVar44._4_4_;
              auVar57._8_4_ = auVar43._8_4_ + auVar44._8_4_;
              auVar57._12_4_ = auVar43._12_4_ + auVar44._12_4_;
              auVar57._16_4_ = auVar43._16_4_ + auVar44._16_4_;
              auVar57._20_4_ = auVar43._20_4_ + auVar44._20_4_;
              auVar57._24_4_ = auVar43._24_4_ + auVar44._24_4_;
              auVar57._28_4_ = auVar43._28_4_ + auVar44._28_4_;
              auVar44 = vsubps_avx(auVar55,auVar50);
              auVar83._0_4_ = auVar55._0_4_ + auVar50._0_4_;
              auVar83._4_4_ = auVar55._4_4_ + auVar50._4_4_;
              auVar83._8_4_ = auVar55._8_4_ + auVar50._8_4_;
              auVar83._12_4_ = auVar55._12_4_ + auVar50._12_4_;
              auVar83._16_4_ = auVar55._16_4_ + auVar50._16_4_;
              auVar83._20_4_ = auVar55._20_4_ + auVar50._20_4_;
              auVar83._24_4_ = auVar55._24_4_ + auVar50._24_4_;
              auVar83._28_4_ = auVar55._28_4_ + auVar50._28_4_;
              auVar50 = vsubps_avx(auVar84,auVar11);
              auVar51._0_4_ = auVar84._0_4_ + auVar11._0_4_;
              auVar51._4_4_ = auVar84._4_4_ + auVar11._4_4_;
              auVar51._8_4_ = auVar84._8_4_ + auVar11._8_4_;
              auVar51._12_4_ = auVar84._12_4_ + auVar11._12_4_;
              auVar51._16_4_ = auVar84._16_4_ + auVar11._16_4_;
              auVar51._20_4_ = auVar84._20_4_ + auVar11._20_4_;
              auVar51._24_4_ = auVar84._24_4_ + auVar11._24_4_;
              auVar51._28_4_ = auVar84._28_4_ + auVar11._28_4_;
              auVar92._0_4_ = auVar50._0_4_ * auVar83._0_4_;
              auVar92._4_4_ = auVar50._4_4_ * auVar83._4_4_;
              auVar92._8_4_ = auVar50._8_4_ * auVar83._8_4_;
              auVar92._12_4_ = auVar50._12_4_ * auVar83._12_4_;
              auVar92._16_4_ = auVar50._16_4_ * auVar83._16_4_;
              auVar92._20_4_ = auVar50._20_4_ * auVar83._20_4_;
              auVar92._24_4_ = auVar50._24_4_ * auVar83._24_4_;
              auVar92._28_4_ = 0;
              auVar62 = vfmsub231ps_fma(auVar92,auVar44,auVar51);
              auVar84._4_4_ = auVar51._4_4_ * auVar13._4_4_;
              auVar84._0_4_ = auVar51._0_4_ * auVar13._0_4_;
              auVar84._8_4_ = auVar51._8_4_ * auVar13._8_4_;
              auVar84._12_4_ = auVar51._12_4_ * auVar13._12_4_;
              auVar84._16_4_ = auVar51._16_4_ * auVar13._16_4_;
              auVar84._20_4_ = auVar51._20_4_ * auVar13._20_4_;
              auVar84._24_4_ = auVar51._24_4_ * auVar13._24_4_;
              auVar84._28_4_ = auVar51._28_4_;
              auVar41 = vfmsub231ps_fma(auVar84,auVar50,auVar57);
              auVar11._4_4_ = auVar44._4_4_ * auVar57._4_4_;
              auVar11._0_4_ = auVar44._0_4_ * auVar57._0_4_;
              auVar11._8_4_ = auVar44._8_4_ * auVar57._8_4_;
              auVar11._12_4_ = auVar44._12_4_ * auVar57._12_4_;
              auVar11._16_4_ = auVar44._16_4_ * auVar57._16_4_;
              auVar11._20_4_ = auVar44._20_4_ * auVar57._20_4_;
              auVar11._24_4_ = auVar44._24_4_ * auVar57._24_4_;
              auVar11._28_4_ = auVar57._28_4_;
              auVar73 = vfmsub231ps_fma(auVar11,auVar13,auVar83);
              local_c60._0_4_ = local_c60._4_4_;
              fStack_c58 = local_c60._4_4_;
              fStack_c54 = local_c60._4_4_;
              fStack_c50 = local_c60._4_4_;
              fStack_c4c = local_c60._4_4_;
              fStack_c48 = local_c60._4_4_;
              fStack_c44 = local_c60._4_4_;
              auVar58._0_4_ = local_c60._4_4_ * auVar73._0_4_;
              auVar58._4_4_ = local_c60._4_4_ * auVar73._4_4_;
              auVar58._8_4_ = local_c60._4_4_ * auVar73._8_4_;
              auVar58._12_4_ = local_c60._4_4_ * auVar73._12_4_;
              auVar58._16_4_ = local_c60._4_4_ * 0.0;
              auVar58._20_4_ = local_c60._4_4_ * 0.0;
              auVar58._24_4_ = local_c60._4_4_ * 0.0;
              auVar58._28_4_ = 0;
              auVar41 = vfmadd231ps_fma(auVar58,local_c40,ZEXT1632(auVar41));
              auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar65,ZEXT1632(auVar62));
              local_9c0 = auVar42._0_4_;
              fStack_9bc = auVar42._4_4_;
              fStack_9b8 = auVar42._8_4_;
              fStack_9b4 = auVar42._12_4_;
              local_980 = ZEXT1632(CONCAT412(auVar41._12_4_ + fStack_9b4 + auVar80._12_4_,
                                             CONCAT48(auVar41._8_4_ + fStack_9b8 + auVar80._8_4_,
                                                      CONCAT44(auVar41._4_4_ +
                                                               fStack_9bc + auVar80._4_4_,
                                                               auVar41._0_4_ +
                                                               local_9c0 + auVar80._0_4_))));
              auVar52._8_4_ = 0x7fffffff;
              auVar52._0_8_ = 0x7fffffff7fffffff;
              auVar52._12_4_ = 0x7fffffff;
              auVar52._16_4_ = 0x7fffffff;
              auVar52._20_4_ = 0x7fffffff;
              auVar52._24_4_ = 0x7fffffff;
              auVar52._28_4_ = 0x7fffffff;
              local_bc0 = ZEXT1632(auVar42);
              auVar43 = vminps_avx(local_bc0,ZEXT1632(auVar80));
              auVar43 = vminps_avx(auVar43,ZEXT1632(auVar41));
              local_ae0 = vandps_avx(local_980,auVar52);
              fVar90 = local_ae0._0_4_ * 1.1920929e-07;
              fVar94 = local_ae0._4_4_ * 1.1920929e-07;
              auVar18._4_4_ = fVar94;
              auVar18._0_4_ = fVar90;
              fVar95 = local_ae0._8_4_ * 1.1920929e-07;
              auVar18._8_4_ = fVar95;
              auVar73._0_4_ = local_ae0._12_4_ * 1.1920929e-07;
              auVar18._12_4_ = auVar73._0_4_;
              fVar96 = local_ae0._16_4_ * 1.1920929e-07;
              auVar18._16_4_ = fVar96;
              fVar97 = local_ae0._20_4_ * 1.1920929e-07;
              auVar18._20_4_ = fVar97;
              fVar98 = local_ae0._24_4_ * 1.1920929e-07;
              auVar18._24_4_ = fVar98;
              auVar18._28_4_ = 0x34000000;
              auVar102._0_8_ = CONCAT44(fVar94,fVar90) ^ 0x8000000080000000;
              auVar102._8_4_ = -fVar95;
              auVar102._12_4_ = -auVar73._0_4_;
              auVar102._16_4_ = -fVar96;
              auVar102._20_4_ = -fVar97;
              auVar102._24_4_ = -fVar98;
              auVar102._28_4_ = 0xb4000000;
              auVar43 = vcmpps_avx(auVar43,auVar102,5);
              auVar84 = vmaxps_avx(local_bc0,ZEXT1632(auVar80));
              auVar55 = vmaxps_avx(auVar84,ZEXT1632(auVar41));
              auVar55 = vcmpps_avx(auVar55,auVar18,2);
              auVar55 = vorps_avx(auVar43,auVar55);
              fVar90 = fStack_cac;
              fVar94 = fStack_ca8;
              fVar95 = fStack_ca4;
              auVar73._0_4_ = local_cb0;
              fVar96 = fStack_cdc;
              fVar97 = fStack_cd8;
              fVar98 = fStack_cd4;
              auVar62._0_4_ = local_ce0;
              if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar55 >> 0x7f,0) == '\0') &&
                    (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar55 >> 0xbf,0) == '\0') &&
                  (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar55[0x1f]) {
LAB_00516e6f:
                auVar100 = ZEXT1664(local_c80);
                auVar104 = ZEXT1664(local_c90);
                auVar107 = ZEXT1664(local_ca0);
                auVar113 = ZEXT1664(local_cc0);
                auVar114 = ZEXT1664(local_cd0);
                auVar124 = ZEXT1664(local_cf0);
                auVar126 = ZEXT1664(local_d00);
                auVar86 = ZEXT1664(local_d10);
                auVar93 = ZEXT1664(local_d20);
              }
              else {
                auVar19._4_4_ = fVar87 * local_a60._4_4_;
                auVar19._0_4_ = fVar79 * local_a60._0_4_;
                auVar19._8_4_ = fVar88 * local_a60._8_4_;
                auVar19._12_4_ = fVar89 * local_a60._12_4_;
                auVar19._16_4_ = fVar108 * local_a60._16_4_;
                auVar19._20_4_ = fVar109 * local_a60._20_4_;
                auVar19._24_4_ = fVar110 * local_a60._24_4_;
                auVar19._28_4_ = auVar43._28_4_;
                local_b00 = 0x80000000;
                uStack_afc = 0x80000000;
                uStack_af8 = 0x80000000;
                uStack_af4 = 0x80000000;
                uStack_af0 = 0x80000000;
                uStack_aec = 0x80000000;
                uStack_ae8 = 0x80000000;
                uStack_ae4 = 0x80000000;
                auVar20._4_4_ = local_a80._4_4_ * fVar67;
                auVar20._0_4_ = local_a80._0_4_ * fVar61;
                auVar20._8_4_ = local_a80._8_4_ * fVar68;
                auVar20._12_4_ = local_a80._12_4_ * fVar69;
                auVar20._16_4_ = local_a80._16_4_ * fVar70;
                auVar20._20_4_ = local_a80._20_4_ * fVar71;
                auVar20._24_4_ = local_a80._24_4_ * fVar72;
                auVar20._28_4_ = auVar84._28_4_;
                auVar42 = vfmsub213ps_fma(local_a80,local_ac0,auVar19);
                auVar21._4_4_ = fVar117 * auVar44._4_4_;
                auVar21._0_4_ = fVar115 * auVar44._0_4_;
                auVar21._8_4_ = fVar118 * auVar44._8_4_;
                auVar21._12_4_ = fVar119 * auVar44._12_4_;
                auVar21._16_4_ = fVar120 * auVar44._16_4_;
                auVar21._20_4_ = fVar121 * auVar44._20_4_;
                auVar21._24_4_ = fVar122 * auVar44._24_4_;
                auVar21._28_4_ = 0x34000000;
                auVar22._4_4_ = fVar67 * auVar50._4_4_;
                auVar22._0_4_ = fVar61 * auVar50._0_4_;
                auVar22._8_4_ = fVar68 * auVar50._8_4_;
                auVar22._12_4_ = fVar69 * auVar50._12_4_;
                auVar22._16_4_ = fVar70 * auVar50._16_4_;
                auVar22._20_4_ = fVar71 * auVar50._20_4_;
                auVar22._24_4_ = fVar72 * auVar50._24_4_;
                auVar22._28_4_ = auVar12._28_4_;
                auVar41 = vfmsub213ps_fma(auVar50,local_aa0,auVar21);
                auVar43 = vandps_avx(auVar19,auVar52);
                auVar84 = vandps_avx(auVar21,auVar52);
                auVar43 = vcmpps_avx(auVar43,auVar84,1);
                local_960 = vblendvps_avx(ZEXT1632(auVar41),ZEXT1632(auVar42),auVar43);
                auVar23._4_4_ = fVar87 * auVar13._4_4_;
                auVar23._0_4_ = fVar79 * auVar13._0_4_;
                auVar23._8_4_ = fVar88 * auVar13._8_4_;
                auVar23._12_4_ = fVar89 * auVar13._12_4_;
                auVar23._16_4_ = fVar108 * auVar13._16_4_;
                auVar23._20_4_ = fVar109 * auVar13._20_4_;
                auVar23._24_4_ = fVar110 * auVar13._24_4_;
                auVar23._28_4_ = auVar43._28_4_;
                auVar42 = vfmsub213ps_fma(auVar13,local_ac0,auVar22);
                auVar24._4_4_ = local_a40._4_4_ * fVar117;
                auVar24._0_4_ = local_a40._0_4_ * fVar115;
                auVar24._8_4_ = local_a40._8_4_ * fVar118;
                auVar24._12_4_ = local_a40._12_4_ * fVar119;
                auVar24._16_4_ = local_a40._16_4_ * fVar120;
                auVar24._20_4_ = local_a40._20_4_ * fVar121;
                auVar24._24_4_ = local_a40._24_4_ * fVar122;
                auVar24._28_4_ = auVar84._28_4_;
                auVar41 = vfmsub213ps_fma(local_a60,auVar12,auVar24);
                auVar43 = vandps_avx(auVar24,auVar52);
                auVar84 = vandps_avx(auVar22,auVar52);
                auVar43 = vcmpps_avx(auVar43,auVar84,1);
                local_940 = vblendvps_avx(ZEXT1632(auVar42),ZEXT1632(auVar41),auVar43);
                auVar42 = vfmsub213ps_fma(local_a40,local_aa0,auVar20);
                auVar41 = vfmsub213ps_fma(auVar44,auVar12,auVar23);
                auVar43 = vandps_avx(auVar20,auVar52);
                auVar84 = vandps_avx(auVar23,auVar52);
                auVar43 = vcmpps_avx(auVar43,auVar84,1);
                local_920 = vblendvps_avx(ZEXT1632(auVar41),ZEXT1632(auVar42),auVar43);
                auVar42 = vpackssdw_avx(auVar55._0_16_,auVar55._16_16_);
                fVar61 = local_920._0_4_;
                fVar67 = local_920._4_4_;
                auVar25._4_4_ = fVar67 * local_c60._4_4_;
                auVar25._0_4_ = fVar61 * local_c60._4_4_;
                fVar68 = local_920._8_4_;
                auVar25._8_4_ = fVar68 * local_c60._4_4_;
                fVar69 = local_920._12_4_;
                auVar25._12_4_ = fVar69 * local_c60._4_4_;
                fVar70 = local_920._16_4_;
                auVar25._16_4_ = fVar70 * local_c60._4_4_;
                fVar71 = local_920._20_4_;
                auVar25._20_4_ = fVar71 * local_c60._4_4_;
                fVar72 = local_920._24_4_;
                auVar25._24_4_ = fVar72 * local_c60._4_4_;
                auVar25._28_4_ = auVar55._28_4_;
                auVar41 = vfmadd213ps_fma(local_c40,local_940,auVar25);
                auVar41 = vfmadd213ps_fma(auVar65,local_960,ZEXT1632(auVar41));
                fVar79 = auVar41._0_4_ + auVar41._0_4_;
                fVar87 = auVar41._4_4_ + auVar41._4_4_;
                fVar88 = auVar41._8_4_ + auVar41._8_4_;
                fVar89 = auVar41._12_4_ + auVar41._12_4_;
                auVar84 = ZEXT1632(CONCAT412(fVar89,CONCAT48(fVar88,CONCAT44(fVar87,fVar79))));
                auVar59._0_4_ = fVar61 * fVar4;
                auVar59._4_4_ = fVar67 * fVar5;
                auVar59._8_4_ = fVar68 * fVar6;
                auVar59._12_4_ = fVar69 * fVar7;
                auVar59._16_4_ = fVar70 * fVar8;
                auVar59._20_4_ = fVar71 * fVar9;
                auVar59._24_4_ = fVar72 * fVar10;
                auVar59._28_4_ = 0;
                auVar41 = vfmadd213ps_fma(local_b80,local_940,auVar59);
                auVar81 = vfmadd213ps_fma(local_b60,local_960,ZEXT1632(auVar41));
                auVar43 = vrcpps_avx(auVar84);
                auVar112._8_4_ = 0x3f800000;
                auVar112._0_8_ = &DAT_3f8000003f800000;
                auVar112._12_4_ = 0x3f800000;
                auVar112._16_4_ = 0x3f800000;
                auVar112._20_4_ = 0x3f800000;
                auVar112._24_4_ = 0x3f800000;
                auVar112._28_4_ = 0x3f800000;
                auVar41 = vfnmadd213ps_fma(auVar43,auVar84,auVar112);
                auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar43,auVar43);
                local_8a0._28_4_ = auVar43._28_4_;
                local_8a0._0_28_ =
                     ZEXT1628(CONCAT412((auVar81._12_4_ + auVar81._12_4_) * auVar41._12_4_,
                                        CONCAT48((auVar81._8_4_ + auVar81._8_4_) * auVar41._8_4_,
                                                 CONCAT44((auVar81._4_4_ + auVar81._4_4_) *
                                                          auVar41._4_4_,
                                                          (auVar81._0_4_ + auVar81._0_4_) *
                                                          auVar41._0_4_))));
                uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar103._4_4_ = uVar37;
                auVar103._0_4_ = uVar37;
                auVar103._8_4_ = uVar37;
                auVar103._12_4_ = uVar37;
                auVar103._16_4_ = uVar37;
                auVar103._20_4_ = uVar37;
                auVar103._24_4_ = uVar37;
                auVar103._28_4_ = uVar37;
                auVar43 = vcmpps_avx(auVar103,local_8a0,2);
                fVar4 = ray->tfar;
                auVar105._4_4_ = fVar4;
                auVar105._0_4_ = fVar4;
                auVar105._8_4_ = fVar4;
                auVar105._12_4_ = fVar4;
                auVar105._16_4_ = fVar4;
                auVar105._20_4_ = fVar4;
                auVar105._24_4_ = fVar4;
                auVar105._28_4_ = fVar4;
                auVar55 = vcmpps_avx(local_8a0,auVar105,2);
                auVar43 = vandps_avx(auVar43,auVar55);
                auVar106._0_8_ = CONCAT44(fVar87,fVar79) ^ 0x8000000080000000;
                auVar106._8_4_ = -fVar88;
                auVar106._12_4_ = -fVar89;
                auVar106._16_4_ = 0x80000000;
                auVar106._20_4_ = 0x80000000;
                auVar106._24_4_ = 0x80000000;
                auVar106._28_4_ = 0x80000000;
                auVar55 = vcmpps_avx(auVar106,auVar84,4);
                auVar43 = vandps_avx(auVar43,auVar55);
                auVar41 = vpackssdw_avx(auVar43._0_16_,auVar43._16_16_);
                auVar42 = vpand_avx(auVar41,auVar42);
                local_900 = vpmovsxwd_avx2(auVar42);
                if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_900 >> 0x7f,0) == '\0') &&
                      (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_900 >> 0xbf,0) == '\0') &&
                    (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_900[0x1f]) goto LAB_00516e6f;
                uStack_9b0 = 0;
                uStack_9ac = 0;
                uStack_9a8 = 0;
                uStack_9a4 = 0;
                local_9a0 = ZEXT1632(auVar80);
                auVar43 = vrcpps_avx(local_980);
                local_820 = local_b20;
                auStack_b98 = auVar65._8_24_;
                local_ba0 = context->scene;
                auVar85._8_4_ = 0x3f800000;
                auVar85._0_8_ = &DAT_3f8000003f800000;
                auVar85._12_4_ = 0x3f800000;
                auVar85._16_4_ = 0x3f800000;
                auVar85._20_4_ = 0x3f800000;
                auVar85._24_4_ = 0x3f800000;
                auVar85._28_4_ = 0x3f800000;
                auVar41 = vfnmadd213ps_fma(local_980,auVar43,auVar85);
                auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar43,auVar43);
                auVar60._8_4_ = 0x219392ef;
                auVar60._0_8_ = 0x219392ef219392ef;
                auVar60._12_4_ = 0x219392ef;
                auVar60._16_4_ = 0x219392ef;
                auVar60._20_4_ = 0x219392ef;
                auVar60._24_4_ = 0x219392ef;
                auVar60._28_4_ = 0x219392ef;
                auVar43 = vcmpps_avx(local_ae0,auVar60,5);
                auVar43 = vandps_avx(auVar43,ZEXT1632(auVar41));
                auVar26._4_4_ = fStack_9bc * auVar43._4_4_;
                auVar26._0_4_ = local_9c0 * auVar43._0_4_;
                auVar26._8_4_ = fStack_9b8 * auVar43._8_4_;
                auVar26._12_4_ = fStack_9b4 * auVar43._12_4_;
                auVar26._16_4_ = auVar43._16_4_ * 0.0;
                auVar26._20_4_ = auVar43._20_4_ * 0.0;
                auVar26._24_4_ = auVar43._24_4_ * 0.0;
                auVar26._28_4_ = 0;
                auVar55 = vminps_avx(auVar26,auVar85);
                auVar27._4_4_ = auVar80._4_4_ * auVar43._4_4_;
                auVar27._0_4_ = auVar80._0_4_ * auVar43._0_4_;
                auVar27._8_4_ = auVar80._8_4_ * auVar43._8_4_;
                auVar27._12_4_ = auVar80._12_4_ * auVar43._12_4_;
                auVar27._16_4_ = auVar43._16_4_ * 0.0;
                auVar27._20_4_ = auVar43._20_4_ * 0.0;
                auVar27._24_4_ = auVar43._24_4_ * 0.0;
                auVar27._28_4_ = auVar43._28_4_;
                auVar43 = vminps_avx(auVar27,auVar85);
                auVar84 = vsubps_avx(auVar85,auVar55);
                auVar44 = vsubps_avx(auVar85,auVar43);
                local_8c0 = vblendvps_avx(auVar43,auVar84,local_b20);
                local_8e0 = vblendvps_avx(auVar55,auVar44,local_b20);
                fVar4 = local_b40._0_4_;
                fVar5 = local_b40._4_4_;
                fVar6 = local_b40._8_4_;
                fVar7 = local_b40._12_4_;
                fVar8 = local_b40._16_4_;
                fVar9 = local_b40._20_4_;
                fVar10 = local_b40._24_4_;
                local_860._4_4_ = fVar5 * local_940._4_4_;
                local_860._0_4_ = fVar4 * local_940._0_4_;
                local_860._8_4_ = fVar6 * local_940._8_4_;
                local_860._12_4_ = fVar7 * local_940._12_4_;
                local_860._16_4_ = fVar8 * local_940._16_4_;
                local_860._20_4_ = fVar9 * local_940._20_4_;
                local_860._24_4_ = fVar10 * local_940._24_4_;
                local_860._28_4_ = local_8c0._28_4_;
                local_840._4_4_ = fVar5 * fVar67;
                local_840._0_4_ = fVar4 * fVar61;
                local_840._8_4_ = fVar6 * fVar68;
                local_840._12_4_ = fVar7 * fVar69;
                local_840._16_4_ = fVar8 * fVar70;
                local_840._20_4_ = fVar9 * fVar71;
                local_840._24_4_ = fVar10 * fVar72;
                local_840._28_4_ = local_920._28_4_;
                local_880[0] = local_960._0_4_ * fVar4;
                local_880[1] = local_960._4_4_ * fVar5;
                local_880[2] = local_960._8_4_ * fVar6;
                local_880[3] = local_960._12_4_ * fVar7;
                fStack_870 = local_960._16_4_ * fVar8;
                fStack_86c = local_960._20_4_ * fVar9;
                fStack_868 = local_960._24_4_ * fVar10;
                uStack_864 = local_8e0._28_4_;
                auVar42 = vpsllw_avx(auVar42,0xf);
                auVar42 = vpacksswb_avx(auVar42,auVar42);
                uVar30 = (ulong)(byte)(SUB161(auVar42 >> 7,0) & 1 |
                                       (SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar42 >> 0x3f,0) << 7);
                auVar100 = ZEXT1664(local_c80);
                auVar104 = ZEXT1664(local_c90);
                auVar107 = ZEXT1664(local_ca0);
                auVar113 = ZEXT1664(local_cc0);
                auVar114 = ZEXT1664(local_cd0);
                auVar124 = ZEXT1664(local_cf0);
                auVar126 = ZEXT1664(local_d00);
                auVar86 = ZEXT1664(local_d10);
                auVar93 = ZEXT1664(local_d20);
                do {
                  uVar38 = 0;
                  for (uVar39 = uVar30; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000
                      ) {
                    uVar38 = uVar38 + 1;
                  }
                  local_c08 = *(uint *)((long)&local_9e0 + uVar38 * 4);
                  lVar32 = *(long *)(*(long *)((long)local_ba0 + 0x1e8) + (ulong)local_c08 * 8);
                  if ((*(uint *)(lVar32 + 0x34) & ray->mask) == 0) {
                    uVar30 = uVar30 ^ 1L << (uVar38 & 0x3f);
                    bVar28 = true;
                  }
                  else {
                    pRVar3 = context->args;
                    if ((pRVar3->filter == (RTCFilterFunctionN)0x0) &&
                       (*(long *)(lVar32 + 0x48) == 0)) {
                      bVar28 = false;
                    }
                    else {
                      local_c60 = uVar36;
                      local_c40._0_8_ = uVar35;
                      uVar35 = (ulong)(uint)((int)uVar38 * 4);
                      local_c14 = *(undefined4 *)(local_8e0 + uVar35);
                      local_c10 = *(undefined4 *)(local_8c0 + uVar35);
                      local_bf0.context = context->user;
                      local_c0c = *(undefined4 *)((long)&local_a00 + uVar35);
                      local_c20 = *(undefined4 *)((long)local_880 + uVar35);
                      local_c1c = *(undefined4 *)(local_860 + uVar35);
                      local_c18 = *(undefined4 *)(local_840 + uVar35);
                      local_c04 = (local_bf0.context)->instID[0];
                      local_c00 = (local_bf0.context)->instPrimID[0];
                      local_bc0._0_4_ = ray->tfar;
                      ray->tfar = *(float *)(local_8a0 + uVar35);
                      local_d4c = -1;
                      local_bf0.valid = &local_d4c;
                      local_bf0.geometryUserPtr = *(void **)(lVar32 + 0x18);
                      local_bf0.hit = (RTCHitN *)&local_c20;
                      local_bf0.N = 1;
                      local_bf0.ray = (RTCRayN *)ray;
                      if (*(code **)(lVar32 + 0x48) == (code *)0x0) {
LAB_00516d63:
                        if (pRVar3->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar3->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(lVar32 + 0x3e) & 0x40) != 0)) {
                            (*pRVar3->filter)(&local_bf0);
                            auVar93 = ZEXT1664(local_d20);
                            auVar86 = ZEXT1664(local_d10);
                            auVar126 = ZEXT1664(local_d00);
                            auVar124 = ZEXT1664(local_cf0);
                            auVar114 = ZEXT1664(local_cd0);
                            auVar113 = ZEXT1664(local_cc0);
                            auVar107 = ZEXT1664(local_ca0);
                            auVar104 = ZEXT1664(local_c90);
                            auVar100 = ZEXT1664(local_c80);
                            auVar73._0_4_ = local_cb0;
                            fVar90 = fStack_cac;
                            fVar94 = fStack_ca8;
                            fVar95 = fStack_ca4;
                            auVar62._0_4_ = local_ce0;
                            fVar96 = fStack_cdc;
                            fVar97 = fStack_cd8;
                            fVar98 = fStack_cd4;
                          }
                          if (*local_bf0.valid == 0) goto LAB_00516e17;
                        }
                        bVar28 = false;
                      }
                      else {
                        local_b60._0_8_ = context;
                        local_b80._0_8_ = ray;
                        (**(code **)(lVar32 + 0x48))(&local_bf0);
                        auVar93 = ZEXT1664(local_d20);
                        auVar86 = ZEXT1664(local_d10);
                        auVar126 = ZEXT1664(local_d00);
                        auVar124 = ZEXT1664(local_cf0);
                        auVar114 = ZEXT1664(local_cd0);
                        auVar113 = ZEXT1664(local_cc0);
                        auVar107 = ZEXT1664(local_ca0);
                        auVar104 = ZEXT1664(local_c90);
                        auVar100 = ZEXT1664(local_c80);
                        context = (RayQueryContext *)local_b60._0_8_;
                        ray = (Ray *)local_b80._0_8_;
                        auVar73._0_4_ = local_cb0;
                        fVar90 = fStack_cac;
                        fVar94 = fStack_ca8;
                        fVar95 = fStack_ca4;
                        auVar62._0_4_ = local_ce0;
                        fVar96 = fStack_cdc;
                        fVar97 = fStack_cd8;
                        fVar98 = fStack_cd4;
                        if (*local_bf0.valid != 0) goto LAB_00516d63;
LAB_00516e17:
                        ray->tfar = (float)local_bc0._0_4_;
                        uVar30 = uVar30 ^ 1L << (uVar38 & 0x3f);
                        bVar28 = true;
                      }
                      uVar35 = local_c40._0_8_;
                      uVar36 = local_c60;
                    }
                  }
                  uVar38 = local_d28;
                  uVar39 = local_d30;
                  if (!bVar28) {
                    iVar29 = 0;
                    if (bVar40) {
                      ray->tfar = -INFINITY;
                      iVar29 = 3;
                    }
                    goto LAB_00516ef6;
                  }
                } while (uVar30 != 0);
              }
              iVar29 = 0;
              uVar33 = uVar33 + 1;
              bVar40 = uVar33 < local_c68;
            } while (uVar33 != local_c68);
          }
        }
LAB_00516ef6:
      } while (iVar29 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }